

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.cpp
# Opt level: O2

void __thiscall HashTable<int>::HashTable(HashTable<int> *this,int *arr,int n)

{
  int *piVar1;
  Node *pNVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar4 = (ulong)(uint)n << 2;
  }
  uVar6 = 0;
  if (0 < n) {
    uVar6 = (ulong)(uint)n;
  }
  piVar1 = (int *)operator_new__(uVar4);
  this->copyArr = piVar1;
  pNVar2 = (Node *)operator_new__(0x140);
  this->HashArray = pNVar2;
  this->numOfArray = n;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    piVar1[uVar5] = arr[uVar5];
  }
  for (lVar3 = 8; lVar3 != 0x148; lVar3 = lVar3 + 0x10) {
    *(undefined8 *)((long)pNVar2 + lVar3 + -8) = 0x98967f0098967f;
    *(undefined8 *)((long)&pNVar2->key + lVar3) = 0;
  }
  CreatHashTable(this);
  return;
}

Assistant:

HashTable(DataType arr[], int n) {
		copyArr = new DataType[n];
		HashArray = new Node[20];
		numOfArray = n;

		for (int i = 0; i < n; i++) {
			copyArr[i] = arr[i];			//拷贝一遍原数据
		}

		for (int i = 0; i < 20; i++) {		//初始化哈希主数组
				HashArray[i].key = MyNull;
				HashArray[i].value = MyNull;
				HashArray[i].next = NULL;
		}

		CreatHashTable();					//构建哈希表
	}